

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall
XInputSimulatorImplLinux::mouseGetPosition(XInputSimulatorImplLinux *this,int *x,int *y)

{
  undefined1 local_44 [4];
  undefined1 local_40 [4];
  uint mask;
  int winY;
  int winX;
  int rootY;
  int rootX;
  Window child;
  Window root;
  int *y_local;
  int *x_local;
  XInputSimulatorImplLinux *this_local;
  
  root = (Window)y;
  y_local = x;
  x_local = (int *)this;
  XQueryPointer(this->display,
                *(undefined8 *)
                 (*(long *)(this->display + 0xe8) + (long)*(int *)(this->display + 0xe0) * 0x80 +
                 0x10),&child,&rootY,&winX,&winY,&mask,local_40,local_44);
  *y_local = winX;
  *(int *)root = winY;
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseGetPosition(int &x, int &y)
{
    Window root, child;
    int rootX, rootY, winX, winY;
    unsigned int mask;

    XQueryPointer(display,DefaultRootWindow(display),&root,&child,
                &rootX,&rootY,&winX,&winY,&mask);

    x = rootX;
    y = rootY;
}